

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

void place_desc_message(WINDOW *win,wchar_t *x,wchar_t *y,char *b)

{
  int iVar1;
  size_t sVar2;
  char *b_local;
  wchar_t *y_local;
  wchar_t *x_local;
  WINDOW *win_local;
  
  if ((b != (char *)0x0) && (*b != '\0')) {
    b[0x4e] = '\0';
    sVar2 = strlen(b);
    if ((0x27 < sVar2) && (L'\'' < *x)) {
      *y = *y + L'\x01';
      *x = L'\0';
    }
    if ((*y < L'\x02') && (iVar1 = wmove(statuswin,*y,*x), iVar1 != -1)) {
      waddnstr(statuswin,b,0xffffffff);
    }
    sVar2 = strlen(b);
    iVar1 = 0x28;
    if (0x25 < sVar2) {
      iVar1 = 0x50;
    }
    *x = iVar1 + *x;
    if (L'(' < *x) {
      *y = *y + L'\x01';
      *x = L'\0';
    }
  }
  return;
}

Assistant:

static void place_desc_message(WINDOW *win, int *x, int *y, char *b)
{
    if (!b || !*b)
	return;

    /* Arrange description messages aligned to 40-character columns,
     * accounting for overflow if needed. */
    b[78] = '\0';
    if (strlen(b) >= 40 && *x >= 40) { (*y)++; *x = 0; }
    if (*y <= 1) mvwaddstr(statuswin, *y, *x, b);
    (*x) += (strlen(b) >= 38 ? 80 : 40);
    if (*x > 40) { (*y)++; *x = 0; }
}